

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# higher_order_functions.c
# Opt level: O2

int zip_add_min_dispatcher(int *a,int *b,int size)

{
  int iVar1;
  
  vrna_cpu_simd_capabilities();
  fun_zip_add_min = fun_zip_add_min_default;
  iVar1 = fun_zip_add_min_default(a,b,size);
  return iVar1;
}

Assistant:

static int
zip_add_min_dispatcher(const int  *a,
                       const int  *b,
                       int        size)
{
  unsigned int features = vrna_cpu_simd_capabilities();

#if VRNA_WITH_SIMD_AVX512
  if (features & VRNA_CPU_SIMD_AVX512F) {
    fun_zip_add_min = &vrna_fun_zip_add_min_avx512;
    goto exec_fun_zip_add_min;
  }

#endif

#if VRNA_WITH_SIMD_SSE41
  if (features & VRNA_CPU_SIMD_SSE41) {
    fun_zip_add_min = &vrna_fun_zip_add_min_sse41;
    goto exec_fun_zip_add_min;
  }

#endif

  fun_zip_add_min = &fun_zip_add_min_default;

exec_fun_zip_add_min:

  return (*fun_zip_add_min)(a, b, size);
}